

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall
Diligent::ThreadPoolImpl::EnqueueTask
          (ThreadPoolImpl *this,IAsyncTask *pTask,IAsyncTask **ppPrerequisites,
          Uint32 NumPrerequisites)

{
  bool bVar1;
  Char *pCVar2;
  float *pfVar3;
  IAsyncTask *pIVar4;
  undefined4 in_register_0000000c;
  float extraout_XMM0_Da;
  float local_b8;
  float local_b4;
  uint local_b0;
  float local_ac;
  Uint32 i;
  float MinPrereqPriority;
  QueuedTaskInfo TaskInfo;
  string msg_1;
  unique_lock<std::mutex> lock;
  undefined1 local_48 [8];
  string msg;
  Uint32 NumPrerequisites_local;
  IAsyncTask **ppPrerequisites_local;
  IAsyncTask *pTask_local;
  ThreadPoolImpl *this_local;
  
  msg.field_2._12_4_ = NumPrerequisites;
  if (pTask == (IAsyncTask *)0x0) {
    FormatString<char[26],char[17]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pTask != nullptr",
               (char (*) [17])CONCAT44(in_register_0000000c,NumPrerequisites));
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"EnqueueTask",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
               ,0xb3);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)((long)&msg_1.field_2 + 8),&this->m_TasksQueueMtx);
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->m_Stop);
    if (bVar1) {
      FormatString<char[32]>
                ((string *)
                 &TaskInfo.Prerequisites.
                  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [32])"Enqueue on a stopped ThreadPool");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"EnqueueTask",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                 ,0xb9);
      std::__cxx11::string::~string
                ((string *)
                 &TaskInfo.Prerequisites.
                  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    QueuedTaskInfo::QueuedTaskInfo((QueuedTaskInfo *)&i);
    RefCntAutoPtr<Diligent::IAsyncTask>::operator=((RefCntAutoPtr<Diligent::IAsyncTask> *)&i,pTask);
    if ((ppPrerequisites != (IAsyncTask **)0x0) && (msg.field_2._12_4_ != 0)) {
      std::
      vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
      ::reserve((vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                 *)&TaskInfo,(ulong)(uint)msg.field_2._12_4_);
      local_ac = 3.4028235e+38;
      for (local_b0 = 0; local_b0 < (uint)msg.field_2._12_4_; local_b0 = local_b0 + 1) {
        if (ppPrerequisites[local_b0] != (IAsyncTask *)0x0) {
          std::
          vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>>>
          ::emplace_back<Diligent::IAsyncTask*&>
                    ((vector<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>>>
                      *)&TaskInfo,ppPrerequisites + local_b0);
          (*(ppPrerequisites[local_b0]->super_IObject)._vptr_IObject[9])();
          pfVar3 = std::min<float>(&local_ac,&local_b4);
          local_ac = *pfVar3;
        }
      }
      (*(pTask->super_IObject)._vptr_IObject[9])();
      if (local_ac < extraout_XMM0_Da) {
        pIVar4 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->
                           ((RefCntAutoPtr<Diligent::IAsyncTask> *)&i);
        (*(pIVar4->super_IObject)._vptr_IObject[8])(local_ac);
      }
    }
    (*(pTask->super_IObject)._vptr_IObject[9])();
    std::
    multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
    ::emplace<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>
              ((multimap<float,Diligent::ThreadPoolImpl::QueuedTaskInfo,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                *)&this->m_TasksQueue,&local_b8,(QueuedTaskInfo *)&i);
    QueuedTaskInfo::~QueuedTaskInfo((QueuedTaskInfo *)&i);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)((long)&msg_1.field_2 + 8));
    std::condition_variable::notify_one();
  }
  return;
}

Assistant:

EnqueueTask(IAsyncTask*  pTask,
                                                IAsyncTask** ppPrerequisites,
                                                Uint32       NumPrerequisites) override final
    {
        VERIFY_EXPR(pTask != nullptr);
        if (pTask == nullptr)
            return;

        {
            std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
            DEV_CHECK_ERR(!m_Stop, "Enqueue on a stopped ThreadPool");

            QueuedTaskInfo TaskInfo;
            TaskInfo.pTask = pTask;
            if (ppPrerequisites != nullptr && NumPrerequisites > 0)
            {
                TaskInfo.Prerequisites.reserve(NumPrerequisites);
                float MinPrereqPriority = +FLT_MAX;
                for (Uint32 i = 0; i < NumPrerequisites; ++i)
                {
                    if (ppPrerequisites[i] != nullptr)
                    {
                        TaskInfo.Prerequisites.emplace_back(ppPrerequisites[i]);
                        MinPrereqPriority = std::min(MinPrereqPriority, ppPrerequisites[i]->GetPriority());
                    }
                }
                if (pTask->GetPriority() > MinPrereqPriority)
                {
                    TaskInfo.pTask->SetPriority(MinPrereqPriority);
                }
            }

            m_TasksQueue.emplace(pTask->GetPriority(), std::move(TaskInfo));
        }
        m_NextTaskCond.notify_one();
    }